

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O0

void aom_calc_highbd_psnr
               (YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b,PSNR_STATS *psnr,uint32_t bit_depth,
               uint32_t in_bit_depth)

{
  uint input_shift_00;
  int iVar1;
  uint in_ECX;
  double *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  uint8_t *puVar2;
  double dVar3;
  double dVar4;
  uint64_t sse_1;
  uint32_t samples_1;
  int h_1;
  int w_1;
  uint64_t sse;
  uint32_t samples;
  int h;
  int w;
  uint input_shift;
  double peak;
  uint32_t total_samples;
  uint64_t total_sse;
  int i;
  int b_strides [3];
  int a_strides [3];
  int heights [3];
  int widths [3];
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  double in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int iVar5;
  uint8_t *puVar6;
  int local_54;
  int local_50 [4];
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  uint local_20;
  uint local_1c;
  double *local_18;
  long local_10;
  long local_8;
  
  local_2c = *(undefined4 *)(in_RDI + 0x10);
  local_28 = *(undefined4 *)(in_RDI + 0x14);
  local_24 = *(undefined4 *)(in_RDI + 0x14);
  local_38 = *(undefined4 *)(in_RDI + 0x18);
  local_34 = *(undefined4 *)(in_RDI + 0x1c);
  local_30 = *(undefined4 *)(in_RDI + 0x1c);
  local_50[3] = *(undefined4 *)(in_RDI + 0x20);
  local_40 = *(undefined4 *)(in_RDI + 0x24);
  local_3c = *(undefined4 *)(in_RDI + 0x24);
  local_50[0] = *(int *)(in_RSI + 0x20);
  local_50[1] = *(undefined4 *)(in_RSI + 0x24);
  local_50[2] = *(undefined4 *)(in_RSI + 0x24);
  puVar6 = (uint8_t *)0x0;
  iVar5 = 0;
  puVar2 = (uint8_t *)(double)(0xff << ((char)in_R8D - 8U & 0x1f));
  input_shift_00 = in_ECX - in_R8D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
    in_stack_ffffffffffffff88 = local_50[(long)local_54 + 9];
    in_stack_ffffffffffffff84 = local_50[(long)local_54 + 6];
    iVar1 = in_stack_ffffffffffffff88 * in_stack_ffffffffffffff84;
    if ((*(uint *)(local_8 + 0xc0) & 8) == 0) {
      in_stack_ffffffffffffff78 =
           (double)get_sse(puVar6,iVar5,puVar2,input_shift_00,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff84);
    }
    else if (input_shift_00 == 0) {
      in_stack_ffffffffffffff78 =
           (double)highbd_get_sse(puVar6,iVar5,puVar2,0,in_stack_ffffffffffffff88,
                                  in_stack_ffffffffffffff84);
    }
    else {
      in_stack_ffffffffffffff78 =
           (double)highbd_get_sse_shift
                             (*(uint8_t **)(local_8 + 0x28 + (long)local_54 * 8),
                              local_50[(long)local_54 + 3],
                              *(uint8_t **)(local_10 + 0x28 + (long)local_54 * 8),local_50[local_54]
                              ,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,input_shift_00);
    }
    local_18[(long)local_54 + 5] = in_stack_ffffffffffffff78;
    *(int *)((long)local_18 + (long)local_54 * 4 + 0x44) = iVar1;
    dVar3 = aom_sse_to_psnr(in_stack_ffffffffffffff78,
                            (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_18[local_54 + 1] = dVar3;
    puVar6 = puVar6 + (long)in_stack_ffffffffffffff78;
    iVar5 = iVar1 + iVar5;
  }
  local_18[4] = (double)puVar6;
  *(int *)(local_18 + 8) = iVar5;
  dVar3 = aom_sse_to_psnr(in_stack_ffffffffffffff78,
                          (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  *local_18 = dVar3;
  if (((*(uint *)(local_8 + 0xc0) & 8) != 0) && (local_20 < local_1c)) {
    puVar2 = (uint8_t *)(double)(0xff << ((char)local_1c - 8U & 0x1f));
    puVar6 = (uint8_t *)0x0;
    iVar5 = 0;
    for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
      in_stack_ffffffffffffff74 = local_50[(long)local_54 + 9];
      in_stack_ffffffffffffff70 = local_50[(long)local_54 + 6];
      in_stack_ffffffffffffff6c = in_stack_ffffffffffffff74 * in_stack_ffffffffffffff70;
      dVar3 = (double)highbd_get_sse(puVar6,iVar5,puVar2,input_shift_00,in_stack_ffffffffffffff88,
                                     in_stack_ffffffffffffff84);
      local_18[(long)local_54 + 0xf] = dVar3;
      *(int *)((long)local_18 + (long)local_54 * 4 + 0x94) = in_stack_ffffffffffffff6c;
      dVar4 = aom_sse_to_psnr(in_stack_ffffffffffffff78,
                              (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
      ;
      local_18[(long)(local_54 + 1) + 10] = dVar4;
      puVar6 = puVar6 + (long)dVar3;
      iVar5 = in_stack_ffffffffffffff6c + iVar5;
    }
    local_18[0xe] = (double)puVar6;
    *(int *)(local_18 + 0x12) = iVar5;
    dVar3 = aom_sse_to_psnr(in_stack_ffffffffffffff78,
                            (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_18[10] = dVar3;
  }
  return;
}

Assistant:

void aom_calc_highbd_psnr(const YV12_BUFFER_CONFIG *a,
                          const YV12_BUFFER_CONFIG *b, PSNR_STATS *psnr,
                          uint32_t bit_depth, uint32_t in_bit_depth) {
  assert(a->y_crop_width == b->y_crop_width);
  assert(a->y_crop_height == b->y_crop_height);
  assert(a->uv_crop_width == b->uv_crop_width);
  assert(a->uv_crop_height == b->uv_crop_height);
  const int widths[3] = { a->y_crop_width, a->uv_crop_width, a->uv_crop_width };
  const int heights[3] = { a->y_crop_height, a->uv_crop_height,
                           a->uv_crop_height };
  const int a_strides[3] = { a->y_stride, a->uv_stride, a->uv_stride };
  const int b_strides[3] = { b->y_stride, b->uv_stride, b->uv_stride };
  int i;
  uint64_t total_sse = 0;
  uint32_t total_samples = 0;
#if CONFIG_LIBVMAF_PSNR_PEAK
  double peak = (double)(255 << (in_bit_depth - 8));
#else
  double peak = (double)((1 << in_bit_depth) - 1);
#endif  // CONFIG_LIBVMAF_PSNR_PEAK
  const unsigned int input_shift = bit_depth - in_bit_depth;

  for (i = 0; i < 3; ++i) {
    const int w = widths[i];
    const int h = heights[i];
    const uint32_t samples = w * h;
    uint64_t sse;
    if (a->flags & YV12_FLAG_HIGHBITDEPTH) {
      if (input_shift) {
        sse = highbd_get_sse_shift(a->buffers[i], a_strides[i], b->buffers[i],
                                   b_strides[i], w, h, input_shift);
      } else {
        sse = highbd_get_sse(a->buffers[i], a_strides[i], b->buffers[i],
                             b_strides[i], w, h);
      }
    } else {
      sse = get_sse(a->buffers[i], a_strides[i], b->buffers[i], b_strides[i], w,
                    h);
    }
    psnr->sse[1 + i] = sse;
    psnr->samples[1 + i] = samples;
    psnr->psnr[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);

    total_sse += sse;
    total_samples += samples;
  }

  psnr->sse[0] = total_sse;
  psnr->samples[0] = total_samples;
  psnr->psnr[0] =
      aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);

  // Compute PSNR based on stream bit depth
  if ((a->flags & YV12_FLAG_HIGHBITDEPTH) && (in_bit_depth < bit_depth)) {
#if CONFIG_LIBVMAF_PSNR_PEAK
    peak = (double)(255 << (bit_depth - 8));
#else
    peak = (double)((1 << bit_depth) - 1);
#endif  // CONFIG_LIBVMAF_PSNR_PEAK
    total_sse = 0;
    total_samples = 0;
    for (i = 0; i < 3; ++i) {
      const int w = widths[i];
      const int h = heights[i];
      const uint32_t samples = w * h;
      uint64_t sse;
      sse = highbd_get_sse(a->buffers[i], a_strides[i], b->buffers[i],
                           b_strides[i], w, h);
      psnr->sse_hbd[1 + i] = sse;
      psnr->samples_hbd[1 + i] = samples;
      psnr->psnr_hbd[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);
      total_sse += sse;
      total_samples += samples;
    }

    psnr->sse_hbd[0] = total_sse;
    psnr->samples_hbd[0] = total_samples;
    psnr->psnr_hbd[0] =
        aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);
  }
}